

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O0

void __thiscall
m2d::savanna::ssl_reuse::
http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::run(http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
      *this,string *host,string *port_str,request<http::string_body> *request)

{
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  *this_00;
  enable_shared_from_this<m2d::savanna::ssl_reuse::interface> local_68;
  code *local_58;
  undefined8 local_50;
  bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
  local_48;
  request<http::string_body> *local_28;
  request<http::string_body> *request_local;
  string *port_str_local;
  string *host_local;
  http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *this_local;
  
  local_28 = request;
  request_local = (request<http::string_body> *)port_str;
  port_str_local = host;
  host_local = (string *)this;
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::operator=(&this->request_,request);
  this_00 = (basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
             *)std::
               __shared_ptr_access<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->resolver_);
  local_58 = ssl_reuse::interface::on_resolve;
  local_50 = 0;
  std::enable_shared_from_this<m2d::savanna::ssl_reuse::interface>::shared_from_this(&local_68);
  boost::beast::
  bind_front_handler<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>
            (&local_48,(beast *)&local_58,(offset_in_interface_to_subr *)&local_68,
             (shared_ptr<m2d::savanna::ssl_reuse::interface> *)request);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<boost::beast::detail::bind_front_wrapper<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>>
            (this_00,host,port_str,&local_48);
  boost::beast::detail::
  bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
  ::~bind_front_wrapper(&local_48);
  std::shared_ptr<m2d::savanna::ssl_reuse::interface>::~shared_ptr
            ((shared_ptr<m2d::savanna::ssl_reuse::interface> *)&local_68);
  return;
}

Assistant:

void run(std::string host, std::string port_str, http::request<http::string_body> request) override {
			request_ = request;
			resolver_->async_resolve(host, port_str, beast::bind_front_handler(&interface::on_resolve, this->shared_from_this()));
		}